

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intervals.cpp
# Opt level: O0

void __thiscall
IntervalsTest_TestNoOverlapFound_Test::TestBody(IntervalsTest_TestNoOverlapFound_Test *this)

{
  allocator<int> *this_00;
  initializer_list<int> __l;
  bool bVar1;
  char *message;
  AssertHelper local_c0;
  Message local_b8;
  vector<int,_std::allocator<int>_> local_b0;
  undefined1 local_98 [8];
  AssertionResult gtest_ar;
  int local_80 [2];
  iterator local_78;
  size_type local_70;
  undefined1 local_68 [8];
  vector<int,_std::allocator<int>_> expected;
  int local_48;
  int local_34 [3];
  undefined1 local_28 [8];
  vector<wasm::Interval,_std::allocator<wasm::Interval>_> intervals;
  IntervalsTest_TestNoOverlapFound_Test *this_local;
  
  intervals.super__Vector_base<wasm::Interval,_std::allocator<wasm::Interval>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<wasm::Interval,_std::allocator<wasm::Interval>_>::vector
            ((vector<wasm::Interval,_std::allocator<wasm::Interval>_> *)local_28);
  local_34[2] = 0;
  local_34[1] = 4;
  local_34[0] = 2;
  std::vector<wasm::Interval,std::allocator<wasm::Interval>>::emplace_back<int,int,int>
            ((vector<wasm::Interval,std::allocator<wasm::Interval>> *)local_28,local_34 + 2,
             local_34 + 1,local_34);
  local_48 = 4;
  expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 8;
  expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 2;
  std::vector<wasm::Interval,std::allocator<wasm::Interval>>::emplace_back<int,int,int>
            ((vector<wasm::Interval,std::allocator<wasm::Interval>> *)local_28,
             &stack0xffffffffffffffb8,
             (int *)((long)&expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 4),
             (int *)&expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  local_80[0] = 0;
  local_80[1] = 1;
  local_78 = local_80;
  local_70 = 2;
  this_00 = (allocator<int> *)
            ((long)&gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            + 7);
  std::allocator<int>::allocator(this_00);
  __l._M_len = local_70;
  __l._M_array = local_78;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_68,__l,this_00);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  ::wasm::IntervalProcessor::filterOverlaps((vector *)&local_b0);
  testing::internal::EqHelper::
  Compare<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_nullptr>
            ((EqHelper *)local_98,"IntervalProcessor::filterOverlaps(intervals)","expected",
             &local_b0,(vector<int,_std::allocator<int>_> *)local_68);
  std::vector<int,_std::allocator<int>_>::~vector(&local_b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/intervals.cpp"
               ,0x19,message);
    testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_68);
  std::vector<wasm::Interval,_std::allocator<wasm::Interval>_>::~vector
            ((vector<wasm::Interval,_std::allocator<wasm::Interval>_> *)local_28);
  return;
}

Assistant:

TEST(IntervalsTest, TestNoOverlapFound) {
  std::vector<Interval> intervals;
  intervals.emplace_back(0, 4, 2);
  intervals.emplace_back(4, 8, 2);
  std::vector<int> expected{0, 1};
  ASSERT_EQ(IntervalProcessor::filterOverlaps(intervals), expected);
}